

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unittest_lite.pb.cc
# Opt level: O3

uint8_t * __thiscall
proto2_unittest::TestEmptyMessageWithExtensionsLite::_InternalSerialize
          (TestEmptyMessageWithExtensionsLite *this,uint8_t *target,EpsCopyOutputStream *stream)

{
  uint size;
  void *data;
  ulong uVar1;
  uint8_t *puVar2;
  
  if (*(short *)((long)&this->field_0 + 10) != 0) {
    target = google::protobuf::internal::ExtensionSet::_InternalSerializeAllImpl
                       (&(this->field_0)._impl_._extensions_,
                        (MessageLite *)_TestEmptyMessageWithExtensionsLite_default_instance_,target,
                        stream);
  }
  uVar1 = (this->super_MessageLite)._internal_metadata_.ptr_;
  if ((uVar1 & 1) != 0) {
    uVar1 = uVar1 & 0xfffffffffffffffe;
    data = *(void **)(uVar1 + 8);
    size = *(uint *)(uVar1 + 0x10);
    if ((long)stream->end_ - (long)target < (long)(int)size) {
      puVar2 = google::protobuf::io::EpsCopyOutputStream::WriteRawFallback(stream,data,size,target);
      return puVar2;
    }
    memcpy(target,data,(ulong)size);
    target = target + (int)size;
  }
  return target;
}

Assistant:

::uint8_t* PROTOBUF_NONNULL TestEmptyMessageWithExtensionsLite::_InternalSerialize(
    ::uint8_t* PROTOBUF_NONNULL target,
    ::google::protobuf::io::EpsCopyOutputStream* PROTOBUF_NONNULL stream) const {
  const TestEmptyMessageWithExtensionsLite& this_ = *this;
#endif  // PROTOBUF_CUSTOM_VTABLE
  // @@protoc_insertion_point(serialize_to_array_start:proto2_unittest.TestEmptyMessageWithExtensionsLite)
  ::uint32_t cached_has_bits = 0;
  (void)cached_has_bits;

  // All extensions.
  target = this_._impl_._extensions_._InternalSerializeAll(&default_instance(),
                                                    target, stream);
  if (ABSL_PREDICT_FALSE(this_._internal_metadata_.have_unknown_fields())) {
    target = stream->WriteRaw(
        this_._internal_metadata_.unknown_fields<std::string>(::google::protobuf::internal::GetEmptyString).data(),
        static_cast<int>(this_._internal_metadata_.unknown_fields<std::string>(::google::protobuf::internal::GetEmptyString).size()), target);
  }
  // @@protoc_insertion_point(serialize_to_array_end:proto2_unittest.TestEmptyMessageWithExtensionsLite)
  return target;
}